

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  int iVar8;
  ImU32 IVar9;
  TransformerLogLog *pTVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  ImPlotContext *pIVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  ImVec2 IVar18;
  ImPlotPoint IVar22;
  float fVar19;
  double in_XMM1_Qa;
  float fVar20;
  float fVar21;
  
  pTVar10 = this->Transformer;
  IVar22.x = (*this->Getter->Getter)(this->Getter->Data,prim + 1);
  pIVar14 = GImPlot;
  dVar16 = log10((double)IVar22.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar14->LogDenX;
  pIVar11 = pIVar14->CurrentPlot;
  dVar4 = (pIVar11->XAxis).Range.Min;
  dVar5 = (pIVar11->XAxis).Range.Max;
  dVar17 = log10(in_XMM1_Qa / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  iVar8 = pTVar10->YAxis;
  pIVar11 = pIVar14->CurrentPlot;
  dVar6 = pIVar11->YAxis[iVar8].Range.Min;
  IVar18.x = (float)((((double)(float)(dVar16 / dVar3) * (dVar5 - dVar4) + dVar4) -
                     (pIVar11->XAxis).Range.Min) * pIVar14->Mx +
                    (double)pIVar14->PixelRange[iVar8].Min.x);
  fVar19 = (float)((((double)(float)(dVar17 / pIVar14->LogDenY[iVar8]) *
                     (pIVar11->YAxis[iVar8].Range.Max - dVar6) + dVar6) - dVar6) *
                   pIVar14->My[iVar8] + (double)pIVar14->PixelRange[iVar8].Min.y);
  fVar2 = (this->P1).x;
  fVar20 = (this->P1).y;
  fVar21 = fVar20;
  if (fVar19 <= fVar20) {
    fVar21 = fVar19;
  }
  bVar15 = false;
  if ((fVar21 < (cull_rect->Max).y) &&
     (fVar20 = (float)(-(uint)(fVar19 <= fVar20) & (uint)fVar20 |
                      ~-(uint)(fVar19 <= fVar20) & (uint)fVar19), pfVar1 = &(cull_rect->Min).y,
     bVar15 = false, *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
    fVar20 = fVar2;
    if (IVar18.x <= fVar2) {
      fVar20 = IVar18.x;
    }
    if (fVar20 < (cull_rect->Max).x) {
      fVar20 = (float)(~-(uint)(IVar18.x <= fVar2) & (uint)IVar18.x |
                      -(uint)(IVar18.x <= fVar2) & (uint)fVar2);
      bVar15 = (cull_rect->Min).x <= fVar20 && fVar20 != (cull_rect->Min).x;
    }
  }
  if (bVar15 != false) {
    fVar20 = (this->P1).y;
    fVar21 = fVar20 + this->HalfWeight;
    fVar20 = fVar20 - this->HalfWeight;
    IVar9 = this->Col;
    IVar7 = *uv;
    pIVar12 = DrawList->_VtxWritePtr;
    (pIVar12->pos).x = fVar2;
    (pIVar12->pos).y = fVar21;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar9;
    pIVar12[1].pos.x = IVar18.x;
    pIVar12[1].pos.y = fVar20;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar9;
    pIVar12[2].pos.x = fVar2;
    pIVar12[2].pos.y = fVar20;
    pIVar12[2].uv = IVar7;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar9;
    pIVar12[3].pos.x = IVar18.x;
    pIVar12[3].pos.y = fVar21;
    pIVar12[3].uv = IVar7;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = DrawList->_VtxCurrentIdx;
    puVar13[1] = DrawList->_VtxCurrentIdx + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    puVar13[3] = DrawList->_VtxCurrentIdx;
    puVar13[4] = DrawList->_VtxCurrentIdx + 1;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar21 = IVar18.x - this->HalfWeight;
    fVar20 = this->HalfWeight + IVar18.x;
    fVar2 = (this->P1).y;
    IVar9 = this->Col;
    IVar7 = *uv;
    pIVar12[4].pos.x = fVar21;
    pIVar12[4].pos.y = fVar19;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar9;
    pIVar12[1].pos.x = fVar20;
    pIVar12[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar9;
    pIVar12[2].pos.x = fVar21;
    pIVar12[2].pos.y = fVar2;
    pIVar12[2].uv = IVar7;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar9;
    pIVar12[3].pos.x = fVar20;
    pIVar12[3].pos.y = fVar19;
    pIVar12[3].uv = IVar7;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = DrawList->_VtxCurrentIdx;
    puVar13[1] = DrawList->_VtxCurrentIdx + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    puVar13[3] = DrawList->_VtxCurrentIdx;
    puVar13[4] = DrawList->_VtxCurrentIdx + 1;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar18.y = fVar19;
  this->P1 = IVar18;
  return bVar15;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }